

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  bool bVar1;
  int iVar2;
  UnitTestImpl *this_00;
  InternalRunDeathTestFlag *this_01;
  TestResult *this_02;
  char *pcVar3;
  char **argv;
  int *piVar4;
  int local_64c;
  string local_648;
  allocator<char> local_621;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  int local_53c;
  pid_t local_538;
  int gtest_retval;
  pid_t child_pid;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_510;
  undefined1 local_4f8 [8];
  Arguments args;
  string local_4c0;
  string local_4a0;
  allocator<char> local_479;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  undefined1 local_338 [8];
  string internal_flag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined1 local_250 [8];
  string filter_flag;
  string local_228;
  allocator<char> local_201;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  int local_13c;
  string local_138;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  int local_3c;
  int local_38;
  int pipe_fd [2];
  int death_test_index;
  TestInfo *info;
  InternalRunDeathTestFlag *flag;
  UnitTestImpl *impl;
  ExecDeathTest *this_local;
  
  this_00 = GetUnitTestImpl();
  this_01 = UnitTestImpl::internal_run_death_test_flag(this_00);
  register0x00000000 = UnitTestImpl::current_test_info(this_00);
  this_02 = TestInfo::result(register0x00000000);
  pipe_fd[0] = TestResult::death_test_count(this_02);
  if (this_01 == (InternalRunDeathTestFlag *)0x0) {
    do {
      iVar2 = pipe(&local_3c);
      bVar1 = IsTrue(iVar2 != -1);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"CHECK failed: File ",&local_101);
        std::operator+(&local_e0,&local_100,
                       "/workspace/llm4binary/github/license_c_cmakelists/loganzartman[P]gl-pic-fluid/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_c0,&local_e0,", line ");
        local_13c = 0x592;
        StreamableToString<int>(&local_138,&local_13c);
        std::operator+(&local_a0,&local_c0,&local_138);
        std::operator+(&local_80,&local_a0,": ");
        std::operator+(&local_60,&local_80,"pipe(pipe_fd) != -1");
        DeathTestAbort(&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        std::allocator<char>::~allocator(&local_101);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    do {
      iVar2 = fcntl(local_38,2,0);
      bVar1 = IsTrue(iVar2 != -1);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_200,"CHECK failed: File ",&local_201);
        std::operator+(&local_1e0,&local_200,
                       "/workspace/llm4binary/github/license_c_cmakelists/loganzartman[P]gl-pic-fluid/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_1c0,&local_1e0,", line ");
        filter_flag.field_2._12_4_ = 0x595;
        StreamableToString<int>(&local_228,(int *)(filter_flag.field_2._M_local_buf + 0xc));
        std::operator+(&local_1a0,&local_1c0,&local_228);
        std::operator+(&local_180,&local_1a0,": ");
        std::operator+(&local_160,&local_180,"fcntl(pipe_fd[1], F_SETFD, 0) != -1");
        DeathTestAbort(&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_200);
        std::allocator<char>::~allocator(&local_201);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"--",
               (allocator<char> *)(internal_flag.field_2._M_local_buf + 0xf));
    std::operator+(&local_2f0,&local_310,"gtest_");
    std::operator+(&local_2d0,&local_2f0,"filter");
    std::operator+(&local_2b0,&local_2d0,"=");
    pcVar3 = TestInfo::test_suite_name(stack0xffffffffffffffd0);
    std::operator+(&local_290,&local_2b0,pcVar3);
    std::operator+(&local_270,&local_290,".");
    pcVar3 = TestInfo::name(stack0xffffffffffffffd0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                   &local_270,pcVar3);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator((allocator<char> *)(internal_flag.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"--",&local_479);
    std::operator+(&local_458,&local_478,"gtest_");
    std::operator+(&local_438,&local_458,"internal_run_death_test");
    std::operator+(&local_418,&local_438,"=");
    std::operator+(&local_3f8,&local_418,this->file_);
    std::operator+(&local_3d8,&local_3f8,"|");
    StreamableToString<int>(&local_4a0,&this->line_);
    std::operator+(&local_3b8,&local_3d8,&local_4a0);
    std::operator+(&local_398,&local_3b8,"|");
    StreamableToString<int>(&local_4c0,pipe_fd);
    std::operator+(&local_378,&local_398,&local_4c0);
    std::operator+(&local_358,&local_378,"|");
    StreamableToString<int>
              ((string *)
               &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                   &local_358,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator(&local_479);
    Arguments::Arguments((Arguments *)local_4f8);
    GetArgvsForDeathTestChildProcess_abi_cxx11_();
    Arguments::AddArguments<std::__cxx11::string>((Arguments *)local_4f8,&local_510);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_510);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    Arguments::AddArgument((Arguments *)local_4f8,pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    Arguments::AddArgument((Arguments *)local_4f8,pcVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&child_pid,"",(allocator<char> *)((long)&gtest_retval + 3));
    DeathTest::set_last_death_test_message((string *)&child_pid);
    std::__cxx11::string::~string((string *)&child_pid);
    std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_retval + 3));
    CaptureStderr();
    FlushInfoLog();
    argv = Arguments::Argv((Arguments *)local_4f8);
    local_538 = ExecDeathTestSpawnChild(argv,local_3c);
    do {
      do {
        local_53c = close(local_38);
        bVar1 = false;
        if (local_53c == -1) {
          piVar4 = __errno_location();
          bVar1 = *piVar4 == 4;
        }
      } while (bVar1);
      if (local_53c == -1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_620,"CHECK failed: File ",&local_621);
        std::operator+(&local_600,&local_620,
                       "/workspace/llm4binary/github/license_c_cmakelists/loganzartman[P]gl-pic-fluid/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_5e0,&local_600,", line ");
        local_64c = 0x5ac;
        StreamableToString<int>(&local_648,&local_64c);
        std::operator+(&local_5c0,&local_5e0,&local_648);
        std::operator+(&local_5a0,&local_5c0,": ");
        std::operator+(&local_580,&local_5a0,"close(pipe_fd[1])");
        std::operator+(&local_560,&local_580," != -1");
        DeathTestAbort(&local_560);
        std::__cxx11::string::~string((string *)&local_560);
        std::__cxx11::string::~string((string *)&local_580);
        std::__cxx11::string::~string((string *)&local_5a0);
        std::__cxx11::string::~string((string *)&local_5c0);
        std::__cxx11::string::~string((string *)&local_648);
        std::__cxx11::string::~string((string *)&local_5e0);
        std::__cxx11::string::~string((string *)&local_600);
        std::__cxx11::string::~string((string *)&local_620);
        std::allocator<char>::~allocator(&local_621);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    ForkingDeathTest::set_child_pid(&this->super_ForkingDeathTest,local_538);
    DeathTestImpl::set_read_fd((DeathTestImpl *)this,local_3c);
    DeathTestImpl::set_spawned((DeathTestImpl *)this,true);
    this_local._4_4_ = OVERSEE_TEST;
    Arguments::~Arguments((Arguments *)local_4f8);
    std::__cxx11::string::~string((string *)local_338);
    std::__cxx11::string::~string((string *)local_250);
  }
  else {
    iVar2 = InternalRunDeathTestFlag::write_fd(this_01);
    DeathTestImpl::set_write_fd((DeathTestImpl *)this,iVar2);
    this_local._4_4_ = EXECUTE_TEST;
  }
  return this_local._4_4_;
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  kFilterFlag + "=" + info->test_suite_name() +
                                  "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}